

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_kv_cursor_release(unqlite *pDb,unqlite_kv_cursor *pCur)

{
  _func_void_unqlite_kv_cursor_ptr *p_Var1;
  int iVar2;
  
  iVar2 = -0x18;
  if (((pDb != (unqlite *)0x0) && (iVar2 = -0x18, pCur != (unqlite_kv_cursor *)0x0)) &&
     (pDb->nMagic == 0xdb7c2712)) {
    p_Var1 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods->xCursorRelease;
    if (p_Var1 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
      (*p_Var1)(pCur);
    }
    SyMemBackendPoolFree(&pDb->sMem,pCur);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int unqlite_kv_cursor_release(unqlite *pDb,unqlite_kv_cursor *pCur)
{
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) || pCur == 0 /* Noop */){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Release the cursor */
	 rc = unqliteReleaseCursor(pDb,pCur);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	 return rc;
}